

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

char * irafrdhead(char *filename,int *lihead)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  size_t sVar3;
  int nihead;
  long nbhead;
  char errmsg [81];
  char *irafheader;
  int nbr;
  FILE *fd;
  int *lihead_local;
  char *filename_local;
  
  *lihead = 0;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    ffpmsg("unable to open IRAF header file:");
    ffpmsg(filename);
    filename_local = (char *)0x0;
  }
  else {
    iVar1 = fseek(__stream,0,2);
    if (iVar1 == 0) {
      sVar3 = ftell(__stream);
      if ((long)sVar3 < 0) {
        ffpmsg("IRAFRHEAD: cannot get pos. in file:");
        ffpmsg(filename);
        filename_local = (char *)0x0;
      }
      else {
        iVar1 = fseek(__stream,0,0);
        if (iVar1 == 0) {
          uVar2 = (int)sVar3 + 5000;
          filename_local = (char *)calloc(1,(long)(int)uVar2);
          if (filename_local == (char *)0x0) {
            snprintf((char *)&nbhead,0x51,"IRAFRHEAD Cannot allocate %d-byte header",(ulong)uVar2);
            ffpmsg((char *)&nbhead);
            ffpmsg(filename);
            filename_local = (char *)0x0;
          }
          else {
            *lihead = uVar2;
            sVar3 = fread(filename_local,1,sVar3,__stream);
            fclose(__stream);
            if ((int)sVar3 < 0x400) {
              snprintf((char *)&nbhead,0x51,"IRAFRHEAD header file: %d / %d bytes read.",
                       sVar3 & 0xffffffff,0x400);
              ffpmsg((char *)&nbhead);
              ffpmsg(filename);
              free(filename_local);
              filename_local = (char *)0x0;
            }
          }
        }
        else {
          ffpmsg("IRAFRHEAD: cannot seek to beginning of file:");
          ffpmsg(filename);
          filename_local = (char *)0x0;
        }
      }
    }
    else {
      ffpmsg("IRAFRHEAD: cannot seek in file:");
      ffpmsg(filename);
      filename_local = (char *)0x0;
    }
  }
  return filename_local;
}

Assistant:

static char *irafrdhead (
    const char *filename,  /* Name of IRAF header file */
    int *lihead)           /* Length of IRAF image header in bytes (returned) */
{
    FILE *fd;
    int nbr;
    char *irafheader;
    char errmsg[FLEN_ERRMSG];
    long nbhead;
    int nihead;

    *lihead = 0;

    /* open the image header file */
    fd = fopen (filename, "rb");
    if (fd == NULL) {
        ffpmsg("unable to open IRAF header file:");
        ffpmsg(filename);
	return (NULL);
	}

    /* Find size of image header file */
    if (fseek(fd, 0, 2) != 0)  /* move to end of the file */
    {
        ffpmsg("IRAFRHEAD: cannot seek in file:");
        ffpmsg(filename);
        return(NULL);
    }

    nbhead = ftell(fd);     /* position = size of file */
    if (nbhead < 0)
    {
        ffpmsg("IRAFRHEAD: cannot get pos. in file:");
        ffpmsg(filename);
        return(NULL);
    }

    if (fseek(fd, 0, 0) != 0) /* move back to beginning */
    {
        ffpmsg("IRAFRHEAD: cannot seek to beginning of file:");
        ffpmsg(filename);
        return(NULL);
    }

    /* allocate initial sized buffer */
    nihead = nbhead + 5000;
    irafheader = (char *) calloc (1, nihead);
    if (irafheader == NULL) {
	snprintf(errmsg, FLEN_ERRMSG,"IRAFRHEAD Cannot allocate %d-byte header",
		      nihead);
        ffpmsg(errmsg);
        ffpmsg(filename);
	return (NULL);
	}
    *lihead = nihead;

    /* Read IRAF header */
    nbr = fread (irafheader, 1, nbhead, fd);
    fclose (fd);

    /* Reject if header less than minimum length */
    if (nbr < LEN_PIXHDR) {
	snprintf(errmsg, FLEN_ERRMSG,"IRAFRHEAD header file: %d / %d bytes read.",
		      nbr,LEN_PIXHDR);
        ffpmsg(errmsg);
        ffpmsg(filename);
	free (irafheader);
	return (NULL);
	}

    return (irafheader);
}